

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O3

void duckdb::ProfileOutputSetting::ResetLocal(ClientContext *context)

{
  ClientConfig *pCVar1;
  undefined1 local_1f8 [40];
  _Alloc_hider local_1d0;
  char local_1c0 [16];
  _Hashtable<duckdb::MetricsType,_duckdb::MetricsType,_std::allocator<duckdb::MetricsType>,_std::__detail::_Identity,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_1b0 [4];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_c8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_90;
  _Any_data local_58;
  _Manager_type local_48;
  _Alloc_hider local_30;
  char local_20 [16];
  
  switchD_00569a20::default(local_1f8,0,0x1e8);
  ClientConfig::ClientConfig((ClientConfig *)local_1f8);
  pCVar1 = ClientConfig::GetConfig(context);
  ::std::__cxx11::string::operator=((string *)&pCVar1->profiler_save_location,(string *)&local_1d0);
  if (local_30._M_p != local_20) {
    operator_delete(local_30._M_p);
  }
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_90);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_c8);
  ::std::
  _Hashtable<duckdb::MetricsType,_duckdb::MetricsType,_std::allocator<duckdb::MetricsType>,_std::__detail::_Identity,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_1b0);
  if (local_1d0._M_p != local_1c0) {
    operator_delete(local_1d0._M_p);
  }
  if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
    operator_delete((void *)local_1f8._0_8_);
  }
  return;
}

Assistant:

void ProfileOutputSetting::ResetLocal(ClientContext &context) {
	ClientConfig::GetConfig(context).profiler_save_location = ClientConfig().profiler_save_location;
}